

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall SimpleLoggerMgr::flushAllLoggers(SimpleLoggerMgr *this,int level,string *msg)

{
  SimpleLogger *this_00;
  uint uVar1;
  bool bVar2;
  reference ppSVar3;
  ulong uVar4;
  undefined8 uVar5;
  uint in_ESI;
  SimpleLogger *in_RDI;
  SimpleLogger *logger;
  SimpleLogger **entry;
  iterator __end1;
  iterator __begin1;
  unordered_set<SimpleLogger_*,_std::hash<SimpleLogger_*>,_std::equal_to<SimpleLogger_*>,_std::allocator<SimpleLogger_*>_>
  *__range1;
  unique_lock<std::mutex> l;
  unordered_set<SimpleLogger_*,_std::hash<SimpleLogger_*>,_std::equal_to<SimpleLogger_*>,_std::allocator<SimpleLogger_*>_>
  *in_stack_ffffffffffffff78;
  unique_lock<std::mutex> *in_stack_ffffffffffffff80;
  _Node_iterator_base<SimpleLogger_*,_false> local_40;
  _Node_iterator_base<SimpleLogger_*,_false> local_38;
  size_t *local_30;
  uint local_c;
  
  local_c = in_ESI;
  std::unique_lock<std::mutex>::unique_lock
            (in_stack_ffffffffffffff80,(mutex_type *)in_stack_ffffffffffffff78);
  local_30 = &in_RDI->curRevnum;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_set<SimpleLogger_*,_std::hash<SimpleLogger_*>,_std::equal_to<SimpleLogger_*>,_std::allocator<SimpleLogger_*>_>
       ::begin(in_stack_ffffffffffffff78);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_set<SimpleLogger_*,_std::hash<SimpleLogger_*>,_std::equal_to<SimpleLogger_*>,_std::allocator<SimpleLogger_*>_>
       ::end(in_stack_ffffffffffffff78);
  while (bVar2 = std::__detail::operator!=(&local_38,&local_40), bVar2) {
    ppSVar3 = std::__detail::_Node_iterator<SimpleLogger_*,_true,_false>::operator*
                        ((_Node_iterator<SimpleLogger_*,_true,_false> *)0x10627d);
    this_00 = *ppSVar3;
    if (this_00 != (SimpleLogger *)0x0) {
      uVar4 = std::__cxx11::string::empty();
      uVar1 = local_c;
      if ((uVar4 & 1) == 0) {
        uVar5 = std::__cxx11::string::c_str();
        SimpleLogger::put(this_00,(int)(ulong)uVar1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/greensky00[P]simple_logger/src/logger.cc"
                          ,"flushAllLoggers",0x28d,"%s",uVar5);
      }
      SimpleLogger::flushAll(in_RDI);
    }
    std::__detail::_Node_iterator<SimpleLogger_*,_true,_false>::operator++
              ((_Node_iterator<SimpleLogger_*,_true,_false> *)in_stack_ffffffffffffff80);
  }
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffff80);
  return;
}

Assistant:

void SimpleLoggerMgr::flushAllLoggers(int level, const std::string& msg) {
    std::unique_lock<std::mutex> l(loggersLock);
    for (auto& entry: loggers) {
        SimpleLogger* logger = entry;
        if (!logger) continue;
        if (!msg.empty()) {
            logger->put(level, __FILE__, __func__, __LINE__, "%s", msg.c_str());
        }
        logger->flushAll();
    }
}